

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestacceptorFixturenextLogonResetSeqNumFlag::RunImpl
          (TestacceptorFixturenextLogonResetSeqNumFlag *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  acceptorFixturenextLogonResetSeqNumFlagHelper fixtureHelper;
  bool ctorOk;
  TestacceptorFixturenextLogonResetSeqNumFlag *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  acceptorFixturenextLogonResetSeqNumFlagHelper::acceptorFixturenextLogonResetSeqNumFlagHelper
            ((acceptorFixturenextLogonResetSeqNumFlagHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::acceptorFixturenextLogonResetSeqNumFlagHelper>
            ((acceptorFixturenextLogonResetSeqNumFlagHelper *)local_648,
             &(this->super_Test).m_details);
  acceptorFixturenextLogonResetSeqNumFlagHelper::~acceptorFixturenextLogonResetSeqNumFlagHelper
            ((acceptorFixturenextLogonResetSeqNumFlagHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, nextLogonResetSeqNumFlag)
{
  object->setResponder( this );
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );

  object->next( createLogout( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK( !object->receivedLogon() );
  CHECK_EQUAL( 1, disconnected );
  CHECK_EQUAL( 1, toLogout );
  CHECK_EQUAL( 1, fromLogout );
  CHECK_EQUAL( 3, object->getExpectedSenderNum() );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );

  FIX42::Logon logon = createLogon( "ISLD", "TW", 1 );
  logon.set( FIX::ResetSeqNumFlag(true) );
  object->next( logon, UtcTimeStamp() );
  CHECK_EQUAL( 2, object->getExpectedSenderNum() );
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );
}